

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void terminal_writec(EditLine *el,wint_t c)

{
  size_t local_40;
  ssize_t vcnt;
  wchar_t visbuf [9];
  wint_t c_local;
  EditLine *el_local;
  
  visbuf[7] = c;
  unique0x10000090 = el;
  local_40 = ct_visual_char((wchar_t *)&vcnt,8,c);
  if ((long)local_40 < 0) {
    local_40 = 0;
  }
  visbuf[local_40 - 2] = L'\0';
  terminal_overwrite(stack0xfffffffffffffff0,(wchar_t *)&vcnt,local_40);
  terminal__flush(stack0xfffffffffffffff0);
  return;
}

Assistant:

libedit_private void
terminal_writec(EditLine *el, wint_t c)
{
	wchar_t visbuf[VISUAL_WIDTH_MAX +1];
	ssize_t vcnt = ct_visual_char(visbuf, VISUAL_WIDTH_MAX, c);
	if (vcnt < 0)
		vcnt = 0;
	visbuf[vcnt] = '\0';
	terminal_overwrite(el, visbuf, (size_t)vcnt);
	terminal__flush(el);
}